

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O2

void __thiscall
aeron::archive::AeronArchive::AeronArchive
          (AeronArchive *this,Context *ctx,ArchiveProxy *archiveProxy)

{
  Context::Context(&this->ctx_,ctx);
  std::make_unique<aeron::archive::ArchiveProxy,aeron::archive::ArchiveProxy_const&>
            ((ArchiveProxy *)&this->archiveProxy_);
  (this->lock_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock_).super___mutex_base._M_mutex + 8) = 0;
  (this->controlResponsePoller_)._M_t.
  super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
  ._M_t.
  super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
  .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>._M_head_impl =
       (ControlResponsePoller *)0x0;
  (this->recordingDescriptorPoller_)._M_t.
  super___uniq_ptr_impl<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
  ._M_t.
  super__Tuple_impl<0UL,_aeron::archive::RecordingDescriptorPoller_*,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
  .super__Head_base<0UL,_aeron::archive::RecordingDescriptorPoller_*,_false>._M_head_impl =
       (RecordingDescriptorPoller *)0x0;
  (this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

AeronArchive::AeronArchive(const Context& ctx, const ArchiveProxy& archiveProxy)
    : ctx_(ctx)
    , archiveProxy_(std::make_unique<ArchiveProxy>(archiveProxy)) {
    // TODO
}